

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

bool __thiscall cppcms::form::validate(form *this)

{
  pointer ppVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  uVar3 = 0;
  bVar4 = true;
  while( true ) {
    ppVar1 = (this->elements_).
             super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->elements_).
                      super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 4) <=
        (ulong)uVar3) break;
    iVar2 = (*(ppVar1[uVar3].first)->_vptr_base_form[2])();
    bVar4 = (bool)(bVar4 & (byte)iVar2);
    uVar3 = uVar3 + 1;
  }
  return bVar4;
}

Assistant:

bool form::validate() 
{
	bool result=true;
	for(unsigned int i=0;i<elements_.size();i++) {
		result = elements_[i].first->validate() & result;
	}
	return result;
}